

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int lookupName(Parse *pParse,char *zDb,char *zTab,char *zCol,NameContext *pNC,Expr *pExpr)

{
  short sVar1;
  ushort uVar2;
  sqlite3 *psVar3;
  SrcList *pSVar4;
  Select *pSVar5;
  IdList *pIVar6;
  ExprList *pEList;
  bool bVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  Table *pTVar11;
  u8 uVar12;
  ushort uVar13;
  int iVar14;
  Column *pCVar15;
  Table **ppTVar16;
  char *pcVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  Schema **ppSVar21;
  ulong uVar22;
  byte *pbVar23;
  int iVar24;
  byte *pbVar25;
  SrcList_item *pSVar26;
  long lVar27;
  char **ppcVar28;
  bool bVar29;
  uint local_b4;
  NameContext *local_a8;
  Schema *local_98;
  SrcList_item *local_90;
  int local_5c;
  
  psVar3 = pParse->db;
  pExpr->iTable = -1;
  pExpr->pTab = (Table *)0x0;
  if ((zDb == (char *)0x0) || ((long)psVar3->nDb < 1)) {
    local_98 = (Schema *)0x0;
  }
  else {
    local_98 = (Schema *)0x0;
    lVar19 = 0;
    do {
      pbVar25 = (byte *)psVar3->aDb[lVar19].zName;
      bVar8 = *pbVar25;
      pbVar23 = (byte *)zDb;
      while ((bVar8 != 0 && (pbVar25 = pbVar25 + 1, ""[bVar8] == ""[*pbVar23]))) {
        pbVar23 = pbVar23 + 1;
        bVar8 = *pbVar25;
      }
      if (""[bVar8] == ""[*pbVar23]) {
        local_98 = psVar3->aDb[lVar19].pSchema;
        break;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != psVar3->nDb);
  }
  bVar7 = false;
  local_90 = (SrcList_item *)0x0;
  local_5c = 0;
  iVar24 = 0;
  local_b4 = 0;
  local_a8 = pNC;
  do {
    if ((local_a8 == (NameContext *)0x0) || (local_b4 != 0)) {
      if ((zTab == (char *)0x0) && ((local_b4 == 0 && ((pExpr->flags & 0x40) != 0)))) {
        pExpr->op = '^';
        pExpr->pTab = (Table *)0x0;
        return 1;
      }
      if (local_b4 != 1) {
        pcVar17 = "ambiguous column name";
        if (local_b4 == 0) {
          pcVar17 = "no such column";
        }
        if (zDb == (char *)0x0) {
          if (zTab == (char *)0x0) {
            sqlite3ErrorMsg(pParse,"%s: %s",pcVar17,zCol);
          }
          else {
            sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar17,zTab,zCol);
          }
        }
        else {
          sqlite3ErrorMsg(pParse,"%s: %s.%s.%s",pcVar17,zDb,zTab,zCol);
        }
        pParse->checkSchema = '\x01';
        pNC->nErr = pNC->nErr + 1;
      }
      uVar2 = pExpr->iColumn;
      if ((-1 < (short)uVar2) && (local_90 != (SrcList_item *)0x0)) {
        uVar13 = 0x3f;
        if (uVar2 < 0x3f) {
          uVar13 = uVar2;
        }
        local_90->colUsed = local_90->colUsed | 1L << ((byte)uVar13 & 0x3f);
      }
      sqlite3ExprDelete(psVar3,pExpr->pLeft);
      pExpr->pLeft = (Expr *)0x0;
      sqlite3ExprDelete(psVar3,pExpr->pRight);
      pExpr->pRight = (Expr *)0x0;
      uVar12 = '<';
      if (!bVar7) {
        uVar12 = 0x98;
      }
      pExpr->op = uVar12;
      goto LAB_00159d02;
    }
    pSVar4 = local_a8->pSrcList;
    if (pSVar4 == (SrcList *)0x0) {
      local_b4 = 0;
    }
    else {
      sVar1 = pSVar4->nSrc;
      if (sVar1 < 1) {
        local_b4 = 0;
      }
      else {
        pSVar26 = pSVar4->a;
        iVar14 = 0;
        local_b4 = 0;
        do {
          pTVar11 = pSVar26->pTab;
          pSVar5 = pSVar26->pSelect;
          if ((pSVar5 == (Select *)0x0) || ((pSVar5->selFlags & 0x200) == 0)) {
LAB_001595f5:
            if ((zDb == (char *)0x0) || (pTVar11->pSchema == local_98)) {
              if (zTab != (char *)0x0) {
                pbVar25 = (byte *)pSVar26->zAlias;
                if (pbVar25 == (byte *)0x0) {
                  pbVar25 = (byte *)pTVar11->zName;
                }
                bVar8 = *pbVar25;
                pbVar23 = (byte *)zTab;
                while ((bVar8 != 0 && (pbVar25 = pbVar25 + 1, ""[bVar8] == ""[*pbVar23]))) {
                  pbVar23 = pbVar23 + 1;
                  bVar8 = *pbVar25;
                }
                if (""[bVar8] != ""[*pbVar23]) goto LAB_001597ea;
              }
              iVar9 = iVar24 + 1;
              if (iVar24 == 0) {
                local_90 = pSVar26;
              }
              iVar24 = iVar9;
              if (0 < pTVar11->nCol) {
                pCVar15 = pTVar11->aCol;
                iVar9 = 0;
                do {
                  pbVar25 = (byte *)pCVar15->zName;
                  bVar8 = *pbVar25;
                  pbVar23 = (byte *)zCol;
                  while ((bVar8 != 0 && (pbVar25 = pbVar25 + 1, ""[bVar8] == ""[*pbVar23]))) {
                    pbVar23 = pbVar23 + 1;
                    bVar8 = *pbVar25;
                  }
                  if (""[bVar8] == ""[*pbVar23]) {
                    if (local_b4 == 1) {
                      if ((pSVar26->jointype & 4) != 0) goto LAB_00159793;
                      pIVar6 = pSVar26->pUsing;
                      if ((pIVar6 != (IdList *)0x0) &&
                         (uVar20 = (ulong)pIVar6->nId, 0 < (long)uVar20)) {
                        bVar29 = true;
                        uVar22 = 0;
                        while( true ) {
                          pbVar25 = (byte *)pIVar6->a[uVar22].zName;
                          bVar8 = *pbVar25;
                          pbVar23 = (byte *)zCol;
                          while ((bVar8 != 0 && (pbVar25 = pbVar25 + 1, ""[bVar8] == ""[*pbVar23])))
                          {
                            pbVar23 = pbVar23 + 1;
                            bVar8 = *pbVar25;
                          }
                          if (""[bVar8] == ""[*pbVar23]) break;
                          uVar22 = uVar22 + 1;
                          bVar29 = uVar22 < uVar20;
                          if (uVar22 == uVar20) goto LAB_001597ab;
                        }
                        if (bVar29) goto LAB_00159793;
                      }
                    }
LAB_001597ab:
                    local_b4 = local_b4 + 1;
                    if (iVar9 == pTVar11->iPKey) {
                      iVar9 = 0xffff;
                    }
                    pExpr->iColumn = (ynVar)iVar9;
                    local_90 = pSVar26;
                    break;
                  }
LAB_00159793:
                  iVar9 = iVar9 + 1;
                  pCVar15 = pCVar15 + 1;
                } while (iVar9 != pTVar11->nCol);
              }
            }
          }
          else {
            lVar19 = (long)pSVar5->pEList->nExpr;
            if (lVar19 < 1) {
              bVar29 = true;
            }
            else {
              ppcVar28 = &pSVar5->pEList->a->zSpan;
              lVar27 = 0;
              bVar29 = false;
              do {
                iVar9 = sqlite3MatchSpanName(*ppcVar28,zCol,zTab,zDb);
                if (iVar9 != 0) {
                  local_b4 = local_b4 + 1;
                  pExpr->iColumn = (ynVar)lVar27;
                  iVar24 = 2;
                  bVar29 = true;
                  local_90 = pSVar26;
                }
                lVar27 = lVar27 + 1;
                ppcVar28 = ppcVar28 + 4;
              } while (lVar19 != lVar27);
              bVar29 = !bVar29;
            }
            if (!(bool)(bVar29 ^ 1U | zTab == (char *)0x0)) goto LAB_001595f5;
          }
LAB_001597ea:
          iVar14 = iVar14 + 1;
          pSVar26 = pSVar26 + 1;
        } while (iVar14 != sVar1);
      }
      if (local_90 == (SrcList_item *)0x0) {
        local_90 = (SrcList_item *)0x0;
      }
      else {
        pExpr->iTable = local_90->iCursor;
        pTVar11 = local_90->pTab;
        pExpr->pTab = pTVar11;
        local_98 = pTVar11->pSchema;
      }
    }
    if (local_b4 == 0 && (zTab != (char *)0x0 && zDb == (char *)0x0)) {
      pTVar11 = pParse->pTriggerTab;
      if (pTVar11 != (Table *)0x0) {
        if (pParse->eTriggerOp == 'j') {
LAB_0015986b:
          bVar8 = 0x6f;
          lVar19 = 0;
          do {
            if (""[bVar8] != ""[(byte)zTab[lVar19]]) {
              pbVar25 = (byte *)(zTab + lVar19);
              break;
            }
            bVar8 = "old"[lVar19 + 1];
            lVar19 = lVar19 + 1;
            pbVar25 = (byte *)(zTab + 3);
          } while (lVar19 != 3);
          iVar14 = 0;
          if (""[bVar8] == ""[*pbVar25]) goto LAB_00159902;
LAB_00159910:
          pTVar11 = (Table *)0x0;
        }
        else {
          bVar8 = 0x6e;
          lVar19 = 0;
          do {
            if (""[bVar8] != ""[(byte)zTab[lVar19]]) {
              pbVar25 = (byte *)(zTab + lVar19);
              break;
            }
            bVar8 = "new"[lVar19 + 1];
            lVar19 = lVar19 + 1;
            pbVar25 = (byte *)(zTab + 3);
          } while (lVar19 != 3);
          iVar14 = 1;
          if (""[bVar8] != ""[*pbVar25]) {
            if (pParse->eTriggerOp != 'i') goto LAB_0015986b;
            goto LAB_00159910;
          }
LAB_00159902:
          pExpr->iTable = iVar14;
        }
        if (pTVar11 != (Table *)0x0) {
          iVar14 = (int)pTVar11->nCol;
          if (pTVar11->nCol < 1) {
            uVar18 = 0;
          }
          else {
            uVar18 = 0;
            do {
              pbVar25 = (byte *)pTVar11->aCol[(int)uVar18].zName;
              bVar8 = *pbVar25;
              pbVar23 = (byte *)zCol;
              while ((bVar8 != 0 && (pbVar25 = pbVar25 + 1, ""[bVar8] == ""[*pbVar23]))) {
                pbVar23 = pbVar23 + 1;
                bVar8 = *pbVar25;
              }
              if ((""[bVar8] == ""[*pbVar23]) && (uVar18 == (int)pTVar11->iPKey)) {
                uVar18 = 0xffffffff;
              }
            } while ((""[bVar8] != ""[*pbVar23]) && (uVar18 = uVar18 + 1, (int)uVar18 < iVar14));
          }
          local_98 = pTVar11->pSchema;
          if (iVar14 <= (int)uVar18) {
            iVar9 = sqlite3IsRowid(zCol);
            uVar18 = uVar18 | -(uint)(iVar9 != 0);
          }
          iVar24 = iVar24 + 1;
          if ((int)uVar18 < iVar14) {
            if ((int)uVar18 < 0) {
              pExpr->affinity = 'd';
            }
            else {
              uVar10 = 1 << ((byte)uVar18 & 0x1f);
              if (0x1f < (int)uVar18) {
                uVar10 = 0xffffffff;
              }
              if (pExpr->iTable == 0) {
                pParse->oldmask = pParse->oldmask | uVar10;
              }
              else {
                pParse->newmask = pParse->newmask | uVar10;
              }
            }
            pExpr->iColumn = (ynVar)uVar18;
            pExpr->pTab = pTVar11;
            bVar7 = true;
            local_b4 = 1;
            goto LAB_00159a0c;
          }
        }
      }
      local_b4 = 0;
    }
LAB_00159a0c:
    if ((local_b4 == 0) && (iVar24 == 1)) {
      iVar14 = sqlite3IsRowid(zCol);
      if (iVar14 != 0) {
        pExpr->iColumn = -1;
        pExpr->affinity = 'd';
      }
      local_b4 = (uint)(iVar14 != 0);
    }
    if ((((zTab == (char *)0x0) && (pEList = local_a8->pEList, pEList != (ExprList *)0x0)) &&
        ((local_b4 == 0 || ((local_a8->ncFlags & 0x10) == 0)))) && (0 < pEList->nExpr)) {
      lVar19 = 0;
      do {
        pbVar25 = (byte *)pEList->a[lVar19].zName;
        iVar14 = 0;
        bVar29 = true;
        if (pbVar25 != (byte *)0x0) {
          bVar8 = *pbVar25;
          pbVar23 = (byte *)zCol;
          while ((bVar8 != 0 && (pbVar25 = pbVar25 + 1, ""[bVar8] == ""[*pbVar23]))) {
            pbVar23 = pbVar23 + 1;
            bVar8 = *pbVar25;
          }
          if (""[bVar8] == ""[*pbVar23]) {
            if (((local_a8->ncFlags & 1) == 0) && (((pEList->a[lVar19].pExpr)->flags & 2) != 0)) {
              bVar29 = false;
              sqlite3ErrorMsg(pParse,"misuse of aliased aggregate %s");
              iVar14 = 1;
            }
            else {
              resolveAlias(pParse,pEList,(int)lVar19,pExpr,"",local_5c);
              local_b4 = 1;
              iVar14 = 0x16;
              local_90 = (SrcList_item *)0x0;
              bVar29 = false;
            }
          }
        }
        if (!bVar29) goto LAB_00159b85;
        lVar19 = lVar19 + 1;
      } while (lVar19 < pEList->nExpr);
    }
    iVar14 = 0;
    if (local_b4 == 0) {
      local_a8 = local_a8->pNext;
      local_5c = local_5c + 1;
      iVar14 = 0;
    }
LAB_00159b85:
  } while (iVar14 == 0);
  if (iVar14 == 0x16) {
LAB_00159d02:
    iVar24 = 2;
    if (local_b4 == 1) {
      if ((pExpr->op != '\x18') &&
         (psVar3 = pParse->db,
         psVar3->xAuth != (_func_int_void_ptr_int_char_ptr_char_ptr_char_ptr_char_ptr *)0x0)) {
        if (local_98 == (Schema *)0x0) {
          uVar20 = 0xfff0bdc0;
        }
        else {
          uVar18 = psVar3->nDb;
          if ((int)uVar18 < 1) {
            uVar20 = 0;
          }
          else {
            ppSVar21 = &psVar3->aDb->pSchema;
            uVar22 = 0;
            do {
              uVar20 = uVar22;
              if (*ppSVar21 == local_98) break;
              uVar22 = uVar22 + 1;
              ppSVar21 = ppSVar21 + 4;
              uVar20 = (ulong)uVar18;
            } while (uVar18 != uVar22);
          }
        }
        if (-1 < (int)uVar20) {
          if (pExpr->op == '<') {
            ppTVar16 = &pParse->pTriggerTab;
LAB_00159d78:
            pTVar11 = *ppTVar16;
          }
          else {
            lVar19 = (long)local_a8->pSrcList->nSrc;
            if (lVar19 < 1) {
              pTVar11 = (Table *)0x0;
            }
            else {
              ppTVar16 = &local_a8->pSrcList->a[0].pTab;
              pTVar11 = (Table *)0x0;
              do {
                if (pExpr->iTable == *(int *)((long)ppTVar16 + 0x1c)) goto LAB_00159d78;
                ppTVar16 = ppTVar16 + 0xd;
                lVar19 = lVar19 + -1;
              } while (lVar19 != 0);
            }
          }
          if (pTVar11 != (Table *)0x0) {
            lVar19 = (long)pExpr->iColumn;
            if ((pExpr->iColumn < 0) && (lVar19 = (long)pTVar11->iPKey, lVar19 < 0)) {
              pcVar17 = "ROWID";
            }
            else {
              pcVar17 = pTVar11->aCol[lVar19].zName;
            }
            iVar24 = sqlite3AuthReadCol(pParse,pTVar11->zName,pcVar17,(int)uVar20);
            if (iVar24 == 2) {
              pExpr->op = 'b';
            }
          }
        }
      }
      pNC->nRef = pNC->nRef + 1;
      iVar24 = 1;
      if (local_a8 != pNC) {
        do {
          pNC = pNC->pNext;
          pNC->nRef = pNC->nRef + 1;
        } while (pNC != local_a8);
      }
    }
  }
  else {
    iVar24 = 2;
  }
  return iVar24;
}

Assistant:

static int lookupName(
  Parse *pParse,       /* The parsing context */
  const char *zDb,     /* Name of the database containing table, or NULL */
  const char *zTab,    /* Name of table containing column, or NULL */
  const char *zCol,    /* Name of the column. */
  NameContext *pNC,    /* The name context used to resolve the name */
  Expr *pExpr          /* Make this EXPR node point to the selected column */
){
  int i, j;                         /* Loop counters */
  int cnt = 0;                      /* Number of matching column names */
  int cntTab = 0;                   /* Number of matching table names */
  int nSubquery = 0;                /* How many levels of subquery */
  sqlite3 *db = pParse->db;         /* The database connection */
  struct SrcList_item *pItem;       /* Use for looping over pSrcList items */
  struct SrcList_item *pMatch = 0;  /* The matching pSrcList item */
  NameContext *pTopNC = pNC;        /* First namecontext in the list */
  Schema *pSchema = 0;              /* Schema of the expression */
  int isTrigger = 0;

  assert( pNC );     /* the name context cannot be NULL. */
  assert( zCol );    /* The Z in X.Y.Z cannot be NULL */
  assert( !ExprHasAnyProperty(pExpr, EP_TokenOnly|EP_Reduced) );

  /* Initialize the node to no-match */
  pExpr->iTable = -1;
  pExpr->pTab = 0;
  ExprSetIrreducible(pExpr);

  /* Translate the schema name in zDb into a pointer to the corresponding
  ** schema.  If not found, pSchema will remain NULL and nothing will match
  ** resulting in an appropriate error message toward the end of this routine
  */
  if( zDb ){
    for(i=0; i<db->nDb; i++){
      assert( db->aDb[i].zName );
      if( sqlite3StrICmp(db->aDb[i].zName,zDb)==0 ){
        pSchema = db->aDb[i].pSchema;
        break;
      }
    }
  }

  /* Start at the inner-most context and move outward until a match is found */
  while( pNC && cnt==0 ){
    ExprList *pEList;
    SrcList *pSrcList = pNC->pSrcList;

    if( pSrcList ){
      for(i=0, pItem=pSrcList->a; i<pSrcList->nSrc; i++, pItem++){
        Table *pTab;
        Column *pCol;
  
        pTab = pItem->pTab;
        assert( pTab!=0 && pTab->zName!=0 );
        assert( pTab->nCol>0 );
        if( pItem->pSelect && (pItem->pSelect->selFlags & SF_NestedFrom)!=0 ){
          int hit = 0;
          pEList = pItem->pSelect->pEList;
          for(j=0; j<pEList->nExpr; j++){
            if( sqlite3MatchSpanName(pEList->a[j].zSpan, zCol, zTab, zDb) ){
              cnt++;
              cntTab = 2;
              pMatch = pItem;
              pExpr->iColumn = j;
              hit = 1;
            }
          }
          if( hit || zTab==0 ) continue;
        }
        if( zDb && pTab->pSchema!=pSchema ){
          continue;
        }
        if( zTab ){
          const char *zTabName = pItem->zAlias ? pItem->zAlias : pTab->zName;
          assert( zTabName!=0 );
          if( sqlite3StrICmp(zTabName, zTab)!=0 ){
            continue;
          }
        }
        if( 0==(cntTab++) ){
          pMatch = pItem;
        }
        for(j=0, pCol=pTab->aCol; j<pTab->nCol; j++, pCol++){
          if( sqlite3StrICmp(pCol->zName, zCol)==0 ){
            /* If there has been exactly one prior match and this match
            ** is for the right-hand table of a NATURAL JOIN or is in a 
            ** USING clause, then skip this match.
            */
            if( cnt==1 ){
              if( pItem->jointype & JT_NATURAL ) continue;
              if( nameInUsingClause(pItem->pUsing, zCol) ) continue;
            }
            cnt++;
            pMatch = pItem;
            /* Substitute the rowid (column -1) for the INTEGER PRIMARY KEY */
            pExpr->iColumn = j==pTab->iPKey ? -1 : (i16)j;
            break;
          }
        }
      }
      if( pMatch ){
        pExpr->iTable = pMatch->iCursor;
        pExpr->pTab = pMatch->pTab;
        pSchema = pExpr->pTab->pSchema;
      }
    } /* if( pSrcList ) */

#ifndef SQLITE_OMIT_TRIGGER
    /* If we have not already resolved the name, then maybe 
    ** it is a new.* or old.* trigger argument reference
    */
    if( zDb==0 && zTab!=0 && cnt==0 && pParse->pTriggerTab!=0 ){
      int op = pParse->eTriggerOp;
      Table *pTab = 0;
      assert( op==TK_DELETE || op==TK_UPDATE || op==TK_INSERT );
      if( op!=TK_DELETE && sqlite3StrICmp("new",zTab) == 0 ){
        pExpr->iTable = 1;
        pTab = pParse->pTriggerTab;
      }else if( op!=TK_INSERT && sqlite3StrICmp("old",zTab)==0 ){
        pExpr->iTable = 0;
        pTab = pParse->pTriggerTab;
      }

      if( pTab ){ 
        int iCol;
        pSchema = pTab->pSchema;
        cntTab++;
        for(iCol=0; iCol<pTab->nCol; iCol++){
          Column *pCol = &pTab->aCol[iCol];
          if( sqlite3StrICmp(pCol->zName, zCol)==0 ){
            if( iCol==pTab->iPKey ){
              iCol = -1;
            }
            break;
          }
        }
        if( iCol>=pTab->nCol && sqlite3IsRowid(zCol) ){
          iCol = -1;        /* IMP: R-44911-55124 */
        }
        if( iCol<pTab->nCol ){
          cnt++;
          if( iCol<0 ){
            pExpr->affinity = SQLITE_AFF_INTEGER;
          }else if( pExpr->iTable==0 ){
            testcase( iCol==31 );
            testcase( iCol==32 );
            pParse->oldmask |= (iCol>=32 ? 0xffffffff : (((u32)1)<<iCol));
          }else{
            testcase( iCol==31 );
            testcase( iCol==32 );
            pParse->newmask |= (iCol>=32 ? 0xffffffff : (((u32)1)<<iCol));
          }
          pExpr->iColumn = (i16)iCol;
          pExpr->pTab = pTab;
          isTrigger = 1;
        }
      }
    }
#endif /* !defined(SQLITE_OMIT_TRIGGER) */

    /*
    ** Perhaps the name is a reference to the ROWID
    */
    if( cnt==0 && cntTab==1 && sqlite3IsRowid(zCol) ){
      cnt = 1;
      pExpr->iColumn = -1;     /* IMP: R-44911-55124 */
      pExpr->affinity = SQLITE_AFF_INTEGER;
    }

    /*
    ** If the input is of the form Z (not Y.Z or X.Y.Z) then the name Z
    ** might refer to an result-set alias.  This happens, for example, when
    ** we are resolving names in the WHERE clause of the following command:
    **
    **     SELECT a+b AS x FROM table WHERE x<10;
    **
    ** In cases like this, replace pExpr with a copy of the expression that
    ** forms the result set entry ("a+b" in the example) and return immediately.
    ** Note that the expression in the result set should have already been
    ** resolved by the time the WHERE clause is resolved.
    */
    if( (pEList = pNC->pEList)!=0
     && zTab==0
     && ((pNC->ncFlags & NC_AsMaybe)==0 || cnt==0)
    ){
      for(j=0; j<pEList->nExpr; j++){
        char *zAs = pEList->a[j].zName;
        if( zAs!=0 && sqlite3StrICmp(zAs, zCol)==0 ){
          Expr *pOrig;
          assert( pExpr->pLeft==0 && pExpr->pRight==0 );
          assert( pExpr->x.pList==0 );
          assert( pExpr->x.pSelect==0 );
          pOrig = pEList->a[j].pExpr;
          if( (pNC->ncFlags&NC_AllowAgg)==0 && ExprHasProperty(pOrig, EP_Agg) ){
            sqlite3ErrorMsg(pParse, "misuse of aliased aggregate %s", zAs);
            return WRC_Abort;
          }
          resolveAlias(pParse, pEList, j, pExpr, "", nSubquery);
          cnt = 1;
          pMatch = 0;
          assert( zTab==0 && zDb==0 );
          goto lookupname_end;
        }
      } 
    }

    /* Advance to the next name context.  The loop will exit when either
    ** we have a match (cnt>0) or when we run out of name contexts.
    */
    if( cnt==0 ){
      pNC = pNC->pNext;
      nSubquery++;
    }
  }

  /*
  ** If X and Y are NULL (in other words if only the column name Z is
  ** supplied) and the value of Z is enclosed in double-quotes, then
  ** Z is a string literal if it doesn't match any column names.  In that
  ** case, we need to return right away and not make any changes to
  ** pExpr.
  **
  ** Because no reference was made to outer contexts, the pNC->nRef
  ** fields are not changed in any context.
  */
  if( cnt==0 && zTab==0 && ExprHasProperty(pExpr,EP_DblQuoted) ){
    pExpr->op = TK_STRING;
    pExpr->pTab = 0;
    return WRC_Prune;
  }

  /*
  ** cnt==0 means there was not match.  cnt>1 means there were two or
  ** more matches.  Either way, we have an error.
  */
  if( cnt!=1 ){
    const char *zErr;
    zErr = cnt==0 ? "no such column" : "ambiguous column name";
    if( zDb ){
      sqlite3ErrorMsg(pParse, "%s: %s.%s.%s", zErr, zDb, zTab, zCol);
    }else if( zTab ){
      sqlite3ErrorMsg(pParse, "%s: %s.%s", zErr, zTab, zCol);
    }else{
      sqlite3ErrorMsg(pParse, "%s: %s", zErr, zCol);
    }
    pParse->checkSchema = 1;
    pTopNC->nErr++;
  }

  /* If a column from a table in pSrcList is referenced, then record
  ** this fact in the pSrcList.a[].colUsed bitmask.  Column 0 causes
  ** bit 0 to be set.  Column 1 sets bit 1.  And so forth.  If the
  ** column number is greater than the number of bits in the bitmask
  ** then set the high-order bit of the bitmask.
  */
  if( pExpr->iColumn>=0 && pMatch!=0 ){
    int n = pExpr->iColumn;
    testcase( n==BMS-1 );
    if( n>=BMS ){
      n = BMS-1;
    }
    assert( pMatch->iCursor==pExpr->iTable );
    pMatch->colUsed |= ((Bitmask)1)<<n;
  }

  /* Clean up and return
  */
  sqlite3ExprDelete(db, pExpr->pLeft);
  pExpr->pLeft = 0;
  sqlite3ExprDelete(db, pExpr->pRight);
  pExpr->pRight = 0;
  pExpr->op = (isTrigger ? TK_TRIGGER : TK_COLUMN);
lookupname_end:
  if( cnt==1 ){
    assert( pNC!=0 );
    if( pExpr->op!=TK_AS ){
      sqlite3AuthRead(pParse, pExpr, pSchema, pNC->pSrcList);
    }
    /* Increment the nRef value on all name contexts from TopNC up to
    ** the point where the name matched. */
    for(;;){
      assert( pTopNC!=0 );
      pTopNC->nRef++;
      if( pTopNC==pNC ) break;
      pTopNC = pTopNC->pNext;
    }
    return WRC_Prune;
  } else {
    return WRC_Abort;
  }
}